

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3BestSnippet(int nSnippet,Fts3Cursor *pCsr,int iCol,u64 mCovered,u64 *pmSeen,
                   SnippetFragment *pFragment,int *piScore)

{
  int iVar1;
  u64 local_90;
  u64 mHighlite;
  u64 mCover;
  int iScore;
  int iPos;
  int i;
  int iBestScore;
  sqlite3_int64 nByte;
  SnippetIter sIter;
  int nList;
  int rc;
  SnippetFragment *pFragment_local;
  u64 *pmSeen_local;
  u64 mCovered_local;
  int iCol_local;
  Fts3Cursor *pCsr_local;
  int nSnippet_local;
  
  iPos = -1;
  memset(&nByte,0,0x28);
  sIter._36_4_ = fts3ExprLoadDoclists(pCsr,&sIter.iCurrent,(int *)0x0);
  pCsr_local._4_4_ = sIter._36_4_;
  if (sIter._36_4_ == 0) {
    _i = (long)sIter.iCurrent * 0x30;
    sIter._16_8_ = sqlite3_malloc64(_i);
    if ((void *)sIter._16_8_ == (void *)0x0) {
      pCsr_local._4_4_ = 7;
    }
    else {
      memset((void *)sIter._16_8_,0,_i);
      sIter.iCol = sIter.iCurrent;
      sIter.aPhrase._0_4_ = 0xffffffff;
      nByte = (sqlite3_int64)pCsr;
      sIter.pCsr._0_4_ = iCol;
      sIter.pCsr._4_4_ = nSnippet;
      sIter._36_4_ = fts3ExprIterate(pCsr->pExpr,fts3SnippetFindPositions,&nByte);
      if (sIter._36_4_ == 0) {
        for (iScore = 0; iScore < sIter.iCurrent; iScore = iScore + 1) {
          if (*(long *)(sIter._16_8_ + (long)iScore * 0x30 + 0x18) != 0) {
            *pmSeen = 1L << ((byte)iScore & 0x3f) | *pmSeen;
          }
        }
        pFragment->iCol = iCol;
        while (iVar1 = fts3SnippetNextCandidate((SnippetIter *)&nByte), iVar1 == 0) {
          fts3SnippetDetails((SnippetIter *)&nByte,mCovered,(int *)((long)&mCover + 4),
                             (int *)&mCover,&mHighlite,&local_90);
          if (iPos < (int)mCover) {
            pFragment->iPos = mCover._4_4_;
            pFragment->hlmask = local_90;
            pFragment->covered = mHighlite;
            iPos = (int)mCover;
          }
        }
        *piScore = iPos;
      }
      sqlite3_free((void *)sIter._16_8_);
      pCsr_local._4_4_ = sIter._36_4_;
    }
  }
  return pCsr_local._4_4_;
}

Assistant:

static int fts3BestSnippet(
  int nSnippet,                   /* Desired snippet length */
  Fts3Cursor *pCsr,               /* Cursor to create snippet for */
  int iCol,                       /* Index of column to create snippet from */
  u64 mCovered,                   /* Mask of phrases already covered */
  u64 *pmSeen,                    /* IN/OUT: Mask of phrases seen */
  SnippetFragment *pFragment,     /* OUT: Best snippet found */
  int *piScore                    /* OUT: Score of snippet pFragment */
){
  int rc;                         /* Return Code */
  int nList;                      /* Number of phrases in expression */
  SnippetIter sIter;              /* Iterates through snippet candidates */
  sqlite3_int64 nByte;            /* Number of bytes of space to allocate */
  int iBestScore = -1;            /* Best snippet score found so far */
  int i;                          /* Loop counter */

  memset(&sIter, 0, sizeof(sIter));

  /* Iterate through the phrases in the expression to count them. The same
  ** callback makes sure the doclists are loaded for each phrase.
  */
  rc = fts3ExprLoadDoclists(pCsr, &nList, 0);
  if( rc!=SQLITE_OK ){
    return rc;
  }

  /* Now that it is known how many phrases there are, allocate and zero
  ** the required space using malloc().
  */
  nByte = sizeof(SnippetPhrase) * nList;
  sIter.aPhrase = (SnippetPhrase *)sqlite3_malloc64(nByte);
  if( !sIter.aPhrase ){
    return SQLITE_NOMEM;
  }
  memset(sIter.aPhrase, 0, nByte);

  /* Initialize the contents of the SnippetIter object. Then iterate through
  ** the set of phrases in the expression to populate the aPhrase[] array.
  */
  sIter.pCsr = pCsr;
  sIter.iCol = iCol;
  sIter.nSnippet = nSnippet;
  sIter.nPhrase = nList;
  sIter.iCurrent = -1;
  rc = fts3ExprIterate(pCsr->pExpr, fts3SnippetFindPositions, (void*)&sIter);
  if( rc==SQLITE_OK ){

    /* Set the *pmSeen output variable. */
    for(i=0; i<nList; i++){
      if( sIter.aPhrase[i].pHead ){
        *pmSeen |= (u64)1 << i;
      }
    }

    /* Loop through all candidate snippets. Store the best snippet in 
     ** *pFragment. Store its associated 'score' in iBestScore.
     */
    pFragment->iCol = iCol;
    while( !fts3SnippetNextCandidate(&sIter) ){
      int iPos;
      int iScore;
      u64 mCover;
      u64 mHighlite;
      fts3SnippetDetails(&sIter, mCovered, &iPos, &iScore, &mCover,&mHighlite);
      assert( iScore>=0 );
      if( iScore>iBestScore ){
        pFragment->iPos = iPos;
        pFragment->hlmask = mHighlite;
        pFragment->covered = mCover;
        iBestScore = iScore;
      }
    }

    *piScore = iBestScore;
  }
  sqlite3_free(sIter.aPhrase);
  return rc;
}